

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_16ac71::SymlinkCommand::getVerboseDescription
          (SymlinkCommand *this,SmallVectorImpl<char> *result)

{
  pointer __s;
  void *pvVar1;
  raw_ostream *prVar2;
  size_t sVar3;
  string *Str;
  StringRef Str_00;
  raw_svector_ostream os;
  
  llvm::raw_svector_ostream::raw_svector_ostream(&os,result);
  llvm::raw_ostream::operator<<((raw_ostream *)&os,"ln -sfh ");
  Str_00 = getActualOutputPath(this);
  sVar3 = Str_00.Length;
  if ((this->super_Command).outputs.
      super__Vector_base<llbuild::buildsystem::BuildNode_*,_std::allocator<llbuild::buildsystem::BuildNode_*>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      (this->super_Command).outputs.
      super__Vector_base<llbuild::buildsystem::BuildNode_*,_std::allocator<llbuild::buildsystem::BuildNode_*>_>
      ._M_impl.super__Vector_impl_data._M_finish || sVar3 != 0) {
    if (sVar3 != 0) {
      pvVar1 = memchr(Str_00.Data,0x20,sVar3);
      if ((long)pvVar1 - (long)Str_00.Data != -1 && pvVar1 != (void *)0x0) {
        prVar2 = llvm::raw_ostream::operator<<((raw_ostream *)&os,'\"');
        prVar2 = llvm::raw_ostream::operator<<(prVar2,Str_00);
        llvm::raw_ostream::operator<<(prVar2,'\"');
        goto LAB_00136be7;
      }
    }
    llvm::raw_ostream::operator<<((raw_ostream *)&os,Str_00);
  }
  else {
    llvm::raw_ostream::operator<<((raw_ostream *)&os,"<<<missing output>>>");
  }
LAB_00136be7:
  llvm::raw_ostream::operator<<((raw_ostream *)&os,' ');
  sVar3 = (this->contents)._M_string_length;
  Str = &this->contents;
  if (sVar3 != 0) {
    __s = (Str->_M_dataplus)._M_p;
    pvVar1 = memchr(__s,0x20,sVar3);
    if ((long)pvVar1 - (long)__s != -1 && pvVar1 != (void *)0x0) {
      prVar2 = llvm::raw_ostream::operator<<((raw_ostream *)&os,'\"');
      prVar2 = llvm::raw_ostream::operator<<(prVar2,Str);
      llvm::raw_ostream::operator<<(prVar2,'\"');
      goto LAB_00136c5c;
    }
  }
  llvm::raw_ostream::operator<<((raw_ostream *)&os,Str);
LAB_00136c5c:
  llvm::raw_ostream::~raw_ostream((raw_ostream *)&os);
  return;
}

Assistant:

virtual void getVerboseDescription(SmallVectorImpl<char> &result) const override {
    llvm::raw_svector_ostream os(result);
    os << "ln -sfh ";
    StringRef outputPath = getActualOutputPath();
    if (outputs.empty() || !outputPath.empty()) {
      // FIXME: This isn't correct, we need utilities for doing shell quoting.
      if (outputPath.find(' ') != StringRef::npos) {
        os << '"' << outputPath << '"';
      } else {
        os << outputPath;
      }
    } else {
      os << "<<<missing output>>>";
    }
    os << ' ';
    // FIXME: This isn't correct, we need utilities for doing shell quoting.
    if (StringRef(contents).find(' ') != StringRef::npos) {
      os << '"' << contents << '"';
    } else {
      os << contents;
    }
  }